

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

size_t Curl_trailers_read(char *buffer,size_t size,size_t nitems,void *raw)

{
  size_t local_50;
  size_t to_copy;
  size_t bytes_left;
  Curl_send_buffer *trailers_buf;
  Curl_easy *data;
  void *raw_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  local_50 = (*(long **)((long)raw + 0x1670))[2] - *(long *)((long)raw + 0x1668);
  if (size * nitems < local_50) {
    local_50 = size * nitems;
  }
  if (local_50 != 0) {
    memcpy(buffer,(void *)(**(long **)((long)raw + 0x1670) + *(long *)((long)raw + 0x1668)),local_50
          );
    *(size_t *)((long)raw + 0x1668) = local_50 + *(long *)((long)raw + 0x1668);
  }
  return local_50;
}

Assistant:

static size_t Curl_trailers_read(char *buffer, size_t size, size_t nitems,
                                 void *raw)
{
  struct Curl_easy *data = (struct Curl_easy *)raw;
  Curl_send_buffer *trailers_buf = data->state.trailers_buf;
  size_t bytes_left = trailers_buf->size_used-data->state.trailers_bytes_sent;
  size_t to_copy = (size*nitems < bytes_left) ? size*nitems : bytes_left;
  if(to_copy) {
    memcpy(buffer,
           &trailers_buf->buffer[data->state.trailers_bytes_sent],
           to_copy);
    data->state.trailers_bytes_sent += to_copy;
  }
  return to_copy;
}